

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O0

void __thiscall Sms_Apu::reset(Sms_Apu *this,uint feedback,int noise_width)

{
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  undefined4 local_10;
  undefined4 local_c;
  
  *(undefined4 *)(in_RDI + 0x428) = 0;
  *(undefined4 *)(in_RDI + 0x42c) = 0;
  if ((in_ESI == 0) || (local_10 = in_EDX, local_c = in_ESI, in_EDX == 0)) {
    local_c = 9;
    local_10 = 0x10;
  }
  *(int *)(in_RDI + 0x6ac) = 1 << ((char)local_10 - 1U & 0x1f);
  *(undefined4 *)(in_RDI + 0x6a8) = 0;
  while (local_10 != 0) {
    *(uint *)(in_RDI + 0x6a8) = *(int *)(in_RDI + 0x6a8) << 1 | local_c & 1;
    local_c = local_c >> 1;
    local_10 = local_10 + -1;
  }
  Sms_Square::reset((Sms_Square *)0x819196);
  Sms_Square::reset((Sms_Square *)0x8191a7);
  Sms_Square::reset((Sms_Square *)0x8191bb);
  Sms_Noise::reset((Sms_Noise *)0x8191cb);
  return;
}

Assistant:

void Sms_Apu::reset( unsigned feedback, int noise_width )
{
	last_time = 0;
	latch = 0;
	
	if ( !feedback || !noise_width )
	{
		feedback = 0x0009;
		noise_width = 16;
	}
	// convert to "Galios configuration"
	looped_feedback = 1 << (noise_width - 1);
	noise_feedback  = 0;
	while ( noise_width-- )
	{
		noise_feedback = (noise_feedback << 1) | (feedback & 1);
		feedback >>= 1;
	}
	
	squares [0].reset();
	squares [1].reset();
	squares [2].reset();
	noise.reset();
}